

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioply.c
# Opt level: O0

int trico_read_ply(uint32_t *nr_of_vertices,float **vertices,float **vertex_normals,
                  uint32_t **vertex_colors,uint32_t *nr_of_triangles,uint32_t **triangles,
                  float **texcoords,char *filename)

{
  int iVar1;
  float *pfVar2;
  uint32_t *puVar3;
  void *pvVar4;
  long lVar5;
  long ntexcoords;
  float *p_uv;
  long ntriangles;
  uint32_t *p_tria_index;
  undefined4 *puStack_f0;
  uint32_t c;
  uint32_t *p_clr;
  long nalpha;
  long nblue;
  long ngreen;
  long nred;
  uint8_t *p_alpha;
  uint8_t *p_blue;
  uint8_t *p_green;
  uint8_t *p_red;
  long nnormals_z;
  long nnormals_y;
  long nnormals_x;
  float *p_normal_pointer_z;
  float *p_normal_pointer_y;
  float *p_normal_pointer_x;
  long nvertices_z;
  long nvertices_y;
  long nvertices_x;
  float *p_vertex_pointer_z;
  float *p_vertex_pointer_y;
  float *p_vertex_pointer_x;
  p_ply ply;
  uint32_t **triangles_local;
  uint32_t *nr_of_triangles_local;
  uint32_t **vertex_colors_local;
  float **vertex_normals_local;
  float **vertices_local;
  uint32_t *nr_of_vertices_local;
  
  *nr_of_vertices = 0;
  *vertices = (float *)0x0;
  *vertex_normals = (float *)0x0;
  *vertex_colors = (uint32_t *)0x0;
  *nr_of_triangles = 0;
  *triangles = (uint32_t *)0x0;
  *texcoords = (float *)0x0;
  ply = (p_ply)triangles;
  triangles_local = (uint32_t **)nr_of_triangles;
  nr_of_triangles_local = (uint32_t *)vertex_colors;
  vertex_colors_local = (uint32_t **)vertex_normals;
  vertex_normals_local = vertices;
  vertices_local = (float **)nr_of_vertices;
  p_vertex_pointer_x = (float *)ply_open(filename,(p_ply_error_cb)0x0,0,(void *)0x0);
  if ((p_ply)p_vertex_pointer_x == (p_ply)0x0) {
    nr_of_vertices_local._4_4_ = 0;
  }
  else {
    iVar1 = ply_read_header((p_ply)p_vertex_pointer_x);
    if (iVar1 == 0) {
      nr_of_vertices_local._4_4_ = 0;
    }
    else {
      p_vertex_pointer_y = (float *)0x0;
      p_vertex_pointer_z = (float *)0x0;
      nvertices_x = 0;
      nvertices_y = ply_set_read_cb((p_ply)p_vertex_pointer_x,"vertex","x",read_vec3_coord,
                                    &p_vertex_pointer_y,0);
      nvertices_z = ply_set_read_cb((p_ply)p_vertex_pointer_x,"vertex","y",read_vec3_coord,
                                    &p_vertex_pointer_z,0);
      p_normal_pointer_x =
           (float *)ply_set_read_cb((p_ply)p_vertex_pointer_x,"vertex","z",read_vec3_coord,
                                    &nvertices_x,0);
      if ((nvertices_y == nvertices_z) && ((float *)nvertices_y == p_normal_pointer_x)) {
        *(int *)vertices_local = (int)nvertices_y;
        if (0 < nvertices_y) {
          pfVar2 = (float *)trico_malloc((ulong)(uint)(*(int *)vertices_local * 3) << 2);
          *vertex_normals_local = pfVar2;
        }
        p_vertex_pointer_y = *vertex_normals_local;
        p_vertex_pointer_z = p_vertex_pointer_y + 1;
        nvertices_x = (long)(p_vertex_pointer_y + 2);
        p_normal_pointer_y = (float *)0x0;
        p_normal_pointer_z = (float *)0x0;
        nnormals_x = 0;
        nnormals_y = ply_set_read_cb((p_ply)p_vertex_pointer_x,"vertex","nx",read_vec3_coord,
                                     &p_normal_pointer_y,0);
        nnormals_z = ply_set_read_cb((p_ply)p_vertex_pointer_x,"vertex","ny",read_vec3_coord,
                                     &p_normal_pointer_z,0);
        p_red = (uint8_t *)
                ply_set_read_cb((p_ply)p_vertex_pointer_x,"vertex","nz",read_vec3_coord,&nnormals_x,
                                0);
        if (((nnormals_y == nnormals_z) && ((uint8_t *)nnormals_y == p_red)) &&
           ((nnormals_y == 0 || ((int)nnormals_y == *(int *)vertices_local)))) {
          if (0 < nnormals_y) {
            puVar3 = (uint32_t *)trico_malloc((ulong)(uint)(*(int *)vertices_local * 3) << 2);
            *vertex_colors_local = puVar3;
          }
          p_normal_pointer_y = (float *)*vertex_colors_local;
          p_normal_pointer_z = p_normal_pointer_y + 1;
          nnormals_x = (long)(p_normal_pointer_y + 2);
          p_green = (uint8_t *)0x0;
          p_blue = (uint8_t *)0x0;
          p_alpha = (uint8_t *)0x0;
          nred = 0;
          ngreen = ply_set_read_cb((p_ply)p_vertex_pointer_x,"vertex","red",read_color,&p_green,0);
          nblue = ply_set_read_cb((p_ply)p_vertex_pointer_x,"vertex","green",read_color,&p_blue,0);
          nalpha = ply_set_read_cb((p_ply)p_vertex_pointer_x,"vertex","blue",read_color,&p_alpha,0);
          p_clr = (uint32_t *)
                  ply_set_read_cb((p_ply)p_vertex_pointer_x,"vertex","alpha",read_color,&nred,0);
          if (ngreen == 0) {
            ngreen = ply_set_read_cb((p_ply)p_vertex_pointer_x,"vertex","r",read_color,&p_green,0);
          }
          if (nblue == 0) {
            nblue = ply_set_read_cb((p_ply)p_vertex_pointer_x,"vertex","g",read_color,&p_blue,0);
          }
          if (nalpha == 0) {
            nalpha = ply_set_read_cb((p_ply)p_vertex_pointer_x,"vertex","b",read_color,&p_alpha,0);
          }
          if (p_clr == (uint32_t *)0x0) {
            p_clr = (uint32_t *)
                    ply_set_read_cb((p_ply)p_vertex_pointer_x,"vertex","a",read_color,&nred,0);
          }
          if (ngreen == 0) {
            ngreen = ply_set_read_cb((p_ply)p_vertex_pointer_x,"vertex","diffuse_red",read_color,
                                     &p_green,0);
          }
          if (nblue == 0) {
            nblue = ply_set_read_cb((p_ply)p_vertex_pointer_x,"vertex","diffuse_green",read_color,
                                    &p_blue,0);
          }
          if (nalpha == 0) {
            nalpha = ply_set_read_cb((p_ply)p_vertex_pointer_x,"vertex","diffuse_blue",read_color,
                                     &p_alpha,0);
          }
          if (p_clr == (uint32_t *)0x0) {
            p_clr = (uint32_t *)
                    ply_set_read_cb((p_ply)p_vertex_pointer_x,"vertex","diffuse_alpha",read_color,
                                    &nred,0);
          }
          if ((((0 < ngreen) || (0 < nblue)) || (0 < nalpha)) || (0 < (long)p_clr)) {
            if ((((ngreen != 0) && ((int)ngreen != *(int *)vertices_local)) ||
                (((nblue != 0 && ((int)nblue != *(int *)vertices_local)) ||
                 ((nalpha != 0 && ((int)nalpha != *(int *)vertices_local)))))) ||
               ((p_clr != (uint32_t *)0x0 && ((int)p_clr != *(int *)vertices_local)))) {
              if (*(int *)vertices_local != 0) {
                free(*vertex_normals_local);
                free(*vertex_colors_local);
                *vertex_normals_local = (float *)0x0;
                *vertex_colors_local = (uint32_t *)0x0;
                *(undefined4 *)vertices_local = 0;
              }
              ply_close((p_ply)p_vertex_pointer_x);
              return 0;
            }
            pvVar4 = trico_malloc((ulong)*(uint *)vertices_local << 2);
            *(void **)nr_of_triangles_local = pvVar4;
            puStack_f0 = *(undefined4 **)nr_of_triangles_local;
            for (p_tria_index._4_4_ = 0; p_tria_index._4_4_ < *(uint *)vertices_local;
                p_tria_index._4_4_ = p_tria_index._4_4_ + 1) {
              *puStack_f0 = 0xffffffff;
              puStack_f0 = puStack_f0 + 1;
            }
          }
          p_green = *(uint8_t **)nr_of_triangles_local;
          p_blue = p_green + 1;
          p_alpha = p_green + 2;
          nred = (long)(p_green + 3);
          ntriangles = 0;
          p_uv = (float *)ply_set_read_cb((p_ply)p_vertex_pointer_x,"face","vertex_indices",
                                          read_face,&ntriangles,0);
          if (p_uv == (float *)0x0) {
            p_uv = (float *)ply_set_read_cb((p_ply)p_vertex_pointer_x,"face","vertex_index",
                                            read_face,&ntriangles,0);
          }
          *(int *)triangles_local = (int)p_uv;
          if (0 < (long)p_uv) {
            pvVar4 = trico_malloc((ulong)(uint)(*(int *)triangles_local * 3) << 2);
            *(void **)ply = pvVar4;
          }
          ntriangles._0_4_ = ply->io_mode;
          ntriangles._4_4_ = ply->storage_mode;
          ntexcoords = 0;
          lVar5 = ply_set_read_cb((p_ply)p_vertex_pointer_x,"face","texcoord",read_texcoord,
                                  &ntexcoords,0);
          if ((lVar5 == 0) || ((int)lVar5 == *(int *)triangles_local)) {
            if (0 < lVar5) {
              pfVar2 = (float *)trico_malloc((ulong)(uint)(*(int *)triangles_local * 6) << 2);
              *texcoords = pfVar2;
            }
            ntexcoords = (long)*texcoords;
            iVar1 = ply_read((p_ply)p_vertex_pointer_x);
            if (iVar1 == 0) {
              nr_of_vertices_local._4_4_ = 0;
            }
            else {
              ply_close((p_ply)p_vertex_pointer_x);
              nr_of_vertices_local._4_4_ = 1;
            }
          }
          else {
            if (*(int *)vertices_local != 0) {
              free(*vertex_normals_local);
              free(*vertex_colors_local);
              free(*(void **)nr_of_triangles_local);
              *vertex_normals_local = (float *)0x0;
              *vertex_colors_local = (uint32_t *)0x0;
              nr_of_triangles_local[0] = 0;
              nr_of_triangles_local[1] = 0;
              *(undefined4 *)vertices_local = 0;
            }
            if (*(int *)triangles_local != 0) {
              free(*(void **)ply);
              ply->io_mode = PLY_READ;
              ply->storage_mode = PLY_BIG_ENDIAN;
              *(undefined4 *)triangles_local = 0;
            }
            ply_close((p_ply)p_vertex_pointer_x);
            nr_of_vertices_local._4_4_ = 0;
          }
        }
        else {
          if (*(int *)vertices_local != 0) {
            free(*vertex_normals_local);
            *vertex_normals_local = (float *)0x0;
            *(undefined4 *)vertices_local = 0;
          }
          ply_close((p_ply)p_vertex_pointer_x);
          nr_of_vertices_local._4_4_ = 0;
        }
      }
      else {
        ply_close((p_ply)p_vertex_pointer_x);
        nr_of_vertices_local._4_4_ = 0;
      }
    }
  }
  return nr_of_vertices_local._4_4_;
}

Assistant:

int trico_read_ply(uint32_t* nr_of_vertices,
  float** vertices,
  float** vertex_normals,
  uint32_t** vertex_colors,
  uint32_t* nr_of_triangles,
  uint32_t** triangles,
  float** texcoords,
  const char* filename)
  {
  *nr_of_vertices = 0;
  *vertices = NULL;
  *vertex_normals = NULL;
  *vertex_colors = NULL;
  *nr_of_triangles = 0;
  *triangles = NULL;
  *texcoords = NULL;

  p_ply ply = ply_open(filename, NULL, 0, NULL);
  if (!ply)
    return 0;
  if (!ply_read_header(ply))
    return 0;

  float* p_vertex_pointer_x = NULL;
  float* p_vertex_pointer_y = NULL;
  float* p_vertex_pointer_z = NULL;

  long nvertices_x = ply_set_read_cb(ply, "vertex", "x", read_vec3_coord, (void*)(&p_vertex_pointer_x), 0);
  long nvertices_y = ply_set_read_cb(ply, "vertex", "y", read_vec3_coord, (void*)(&p_vertex_pointer_y), 0);
  long nvertices_z = ply_set_read_cb(ply, "vertex", "z", read_vec3_coord, (void*)(&p_vertex_pointer_z), 0);

  if ((nvertices_x != nvertices_y) || (nvertices_x != nvertices_z))
    {
    ply_close(ply);
    return 0;
    }

  *nr_of_vertices = (uint32_t)nvertices_x;

  if (nvertices_x > 0)
    *vertices = (float*)trico_malloc(*nr_of_vertices * 3 * sizeof(float));
  p_vertex_pointer_x = (float*)(*vertices);
  p_vertex_pointer_y = p_vertex_pointer_x + 1;
  p_vertex_pointer_z = p_vertex_pointer_x + 2;

  float* p_normal_pointer_x = NULL;
  float* p_normal_pointer_y = NULL;
  float* p_normal_pointer_z = NULL;

  long nnormals_x = ply_set_read_cb(ply, "vertex", "nx", read_vec3_coord, (void*)(&p_normal_pointer_x), 0);
  long nnormals_y = ply_set_read_cb(ply, "vertex", "ny", read_vec3_coord, (void*)(&p_normal_pointer_y), 0);
  long nnormals_z = ply_set_read_cb(ply, "vertex", "nz", read_vec3_coord, (void*)(&p_normal_pointer_z), 0);

  if ((nnormals_x != nnormals_y) || (nnormals_x != nnormals_z) || (nnormals_x && ((uint32_t)nnormals_x != *nr_of_vertices)))
    {
    if (*nr_of_vertices)
      {
      free(*vertices);
      *vertices = NULL;
      *nr_of_vertices = 0;
      }
    ply_close(ply);
    return 0;
    }

  if (nnormals_x > 0)
    *vertex_normals = (float*)trico_malloc(*nr_of_vertices * 3 * sizeof(float));
  p_normal_pointer_x = (float*)(*vertex_normals);
  p_normal_pointer_y = p_normal_pointer_x + 1;
  p_normal_pointer_z = p_normal_pointer_x + 2;

  uint8_t* p_red = NULL;
  uint8_t* p_green = NULL;
  uint8_t* p_blue = NULL;
  uint8_t* p_alpha = NULL;

  long nred = ply_set_read_cb(ply, "vertex", "red", read_color, (void*)(&p_red), 0);
  long ngreen = ply_set_read_cb(ply, "vertex", "green", read_color, (void*)(&p_green), 0);
  long nblue = ply_set_read_cb(ply, "vertex", "blue", read_color, (void*)(&p_blue), 0);
  long nalpha = ply_set_read_cb(ply, "vertex", "alpha", read_color, (void*)(&p_alpha), 0);

  if (nred == 0)
    nred = ply_set_read_cb(ply, "vertex", "r", read_color, (void*)(&p_red), 0);
  if (ngreen == 0)
    ngreen = ply_set_read_cb(ply, "vertex", "g", read_color, (void*)(&p_green), 0);
  if (nblue == 0)
    nblue = ply_set_read_cb(ply, "vertex", "b", read_color, (void*)(&p_blue), 0);
  if (nalpha == 0)
    nalpha = ply_set_read_cb(ply, "vertex", "a", read_color, (void*)(&p_alpha), 0);

  if (nred == 0)
    nred = ply_set_read_cb(ply, "vertex", "diffuse_red", read_color, (void*)(&p_red), 0);
  if (ngreen == 0)
    ngreen = ply_set_read_cb(ply, "vertex", "diffuse_green", read_color, (void*)(&p_green), 0);
  if (nblue == 0)
    nblue = ply_set_read_cb(ply, "vertex", "diffuse_blue", read_color, (void*)(&p_blue), 0);
  if (nalpha == 0)
    nalpha = ply_set_read_cb(ply, "vertex", "diffuse_alpha", read_color, (void*)(&p_alpha), 0);

  if (nred > 0 || ngreen > 0 || nblue > 0 || nalpha > 0)
    {
    if ((nred && ((uint32_t)nred != *nr_of_vertices)) || (ngreen && ((uint32_t)ngreen != *nr_of_vertices)) || (nblue && ((uint32_t)nblue != *nr_of_vertices)) || (nalpha && ((uint32_t)nalpha != *nr_of_vertices)))
      {
      if (*nr_of_vertices)
        {
        free(*vertices);
        free(*vertex_normals);
        *vertices = NULL;
        *vertex_normals = NULL;
        *nr_of_vertices = 0;
        }
      ply_close(ply);
      return 0;
      }
    *vertex_colors = (uint32_t*)trico_malloc(*nr_of_vertices * sizeof(uint32_t));
    uint32_t* p_clr = *vertex_colors;
    for (uint32_t c = 0; c < *nr_of_vertices; ++c)
      *p_clr++ = 0xffffffff;
    }

  p_red = (uint8_t*)(*vertex_colors);
  p_green = p_red + 1;
  p_blue = p_red + 2;
  p_alpha = p_red + 3;

  uint32_t* p_tria_index = NULL;

  long ntriangles = ply_set_read_cb(ply, "face", "vertex_indices", read_face, (void*)(&p_tria_index), 0);
  if (ntriangles == 0)
    ntriangles = ply_set_read_cb(ply, "face", "vertex_index", read_face, (void*)(&p_tria_index), 0);

  *nr_of_triangles = (uint32_t)ntriangles;

  if (ntriangles > 0)
    *triangles = (uint32_t*)trico_malloc(*nr_of_triangles * 3 * sizeof(uint32_t));

  p_tria_index = (uint32_t*)(*triangles);

  float* p_uv = NULL;

  long ntexcoords = ply_set_read_cb(ply, "face", "texcoord", read_texcoord, (void*)(&p_uv), 0);

  if (ntexcoords && ((uint32_t)ntexcoords != *nr_of_triangles))
    {
    if (*nr_of_vertices)
      {
      free(*vertices);
      free(*vertex_normals);
      free(*vertex_colors);
      *vertices = NULL;
      *vertex_normals = NULL;
      *vertex_colors = NULL;
      *nr_of_vertices = 0;
      }
    if (*nr_of_triangles)
      {
      free(*triangles);
      *triangles = NULL;
      *nr_of_triangles = 0;
      }
    ply_close(ply);
    return 0;
    }

  if (ntexcoords > 0)
    *texcoords = (float*)trico_malloc(*nr_of_triangles * 6 * sizeof(float));

  p_uv = (float*)(*texcoords);

  if (!ply_read(ply))
    return 0;

  ply_close(ply);

  return 1;
  }